

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test::TestBody
          (CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test *this)

{
  element_type *peVar1;
  future_status fVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result_base *p_Var4;
  undefined8 uVar5;
  char *in_R9;
  _State_baseV2 *__tmp;
  bool bVar6;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  AssertionResult gtest_ar_;
  future<void> asyncFuture;
  CountdownLatch latch;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  undefined1 local_d8 [32];
  _func_int **local_b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  __basic_future<void> local_a0;
  CountdownLatch local_90 [96];
  
  bidfx_public_api::tools::CountdownLatch::CountdownLatch(local_90,0);
  local_d8._0_8_ = (element_type *)0x0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0029e8f0;
  peVar1 = (element_type *)(p_Var3 + 1);
  p_Var3[2]._M_use_count = 0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var3[1]._M_weak_count + 1) = 0;
  p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[3]._M_use_count = 0;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0029e940;
  p_Var4 = (_Result_base *)operator_new(0x10);
  *(undefined8 *)p_Var4 = 0;
  *(undefined8 *)(p_Var4 + 8) = 0;
  std::__future_base::_Result_base::_Result_base(p_Var4);
  *(undefined ***)p_Var4 = &PTR__M_destroy_0029ed08;
  p_Var3[4]._vptr__Sp_counted_base = (_func_int **)p_Var4;
  *(CountdownLatch **)&p_Var3[4]._M_use_count = local_90;
  local_b8 = (_func_int **)0x0;
  local_e0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
  ;
  *(undefined ***)local_e0.ptr_ = &PTR___State_0029e998;
  *(element_type **)(local_e0.ptr_ + 8) = peVar1;
  *(code **)(local_e0.ptr_ + 0x10) =
       std::__future_base::
       _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp:85:33)>_>,_void>
       ::_M_run;
  *(long *)(local_e0.ptr_ + 0x18) = 0;
  std::thread::_M_start_thread(&local_b8,&local_e0,0);
  if (local_e0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_e0.ptr_ + 8))();
  }
  uVar5 = local_d8._8_8_;
  if (p_Var3[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
    std::terminate();
  }
  p_Var3[3]._vptr__Sp_counted_base = local_b8;
  bVar6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8._0_8_ = peVar1;
  local_d8._8_8_ = p_Var3;
  if (bVar6) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
  }
  if ((element_type *)local_d8._0_8_ == (element_type *)0x0) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0029e9d8;
    p_Var3[2]._M_use_count = 0;
    p_Var3[1]._M_use_count = 0;
    p_Var3[1]._M_weak_count = 0;
    *(undefined8 *)((long)&p_Var3[1]._M_weak_count + 1) = 0;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_0029ea28;
    p_Var4 = (_Result_base *)operator_new(0x10);
    *(undefined8 *)p_Var4 = 0;
    *(undefined8 *)(p_Var4 + 8) = 0;
    std::__future_base::_Result_base::_Result_base(p_Var4);
    uVar5 = local_d8._8_8_;
    *(undefined ***)p_Var4 = &PTR__M_destroy_0029ed08;
    p_Var3[3]._vptr__Sp_counted_base = (_func_int **)p_Var4;
    *(CountdownLatch **)&p_Var3[3]._M_use_count = local_90;
    bVar6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8._0_8_ = (element_type *)(p_Var3 + 1);
    local_d8._8_8_ = p_Var3;
    if (bVar6) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
    }
  }
  std::__basic_future<void>::__basic_future(&local_a0,(__state_type *)local_d8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  local_d8._0_8_ = (element_type *)0x1388;
  if (local_a0._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_State_baseV2 *)0x0) {
    fVar2 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1000l>>
                      (local_a0._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(duration<long,_std::ratio<1L,_1000L>_> *)local_d8);
    local_b8 = (_func_int **)CONCAT71(local_b8._1_7_,fVar2 != timeout);
    local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (fVar2 == timeout) {
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)&local_b8,
                 (AssertionResult *)
                 "asyncFuture.wait_for(std::chrono::milliseconds(5000)) != std::future_status::timeout"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                 ,0x58,(char *)local_d8._0_8_);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      }
      if (local_e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) &&
           (local_e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_e0.ptr_ + 8))();
        }
        local_e0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_a0._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::condition_variable::~condition_variable((condition_variable *)local_90);
    return;
  }
  uVar5 = std::__throw_future_error(3);
  __clang_call_terminate(uVar5);
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchFromZeroIndefiniteAwait)
{
    CountdownLatch latch = CountdownLatch(0);
    auto asyncFuture = std::async(
            std::launch::async, [&latch]() {
                latch.Await();
            });
    EXPECT_TRUE(asyncFuture.wait_for(std::chrono::milliseconds(5000)) != std::future_status::timeout);
}